

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int JS_DefinePropertyValueUint32(JSContext *ctx,JSValue this_obj,uint32_t idx,JSValue val,int flags)

{
  JSValue prop;
  JSValue this_obj_00;
  int iVar1;
  uint in_ECX;
  JSContext *in_RDI;
  JSValueUnion in_R8;
  int64_t in_R9;
  JSValue v;
  undefined4 in_stack_ffffffffffffff70;
  JSValue in_stack_ffffffffffffffa0;
  undefined4 uStack_2c;
  undefined8 local_28;
  undefined4 uStack_c;
  
  if (in_ECX < 0x80000000) {
    uStack_2c = uStack_c;
    local_28 = (JSContext *)0x0;
  }
  else {
    in_stack_ffffffffffffffa0 = __JS_NewFloat64(in_RDI,(double)in_ECX);
    uStack_2c = in_stack_ffffffffffffffa0.u._4_4_;
    local_28 = (JSContext *)in_stack_ffffffffffffffa0.tag;
  }
  this_obj_00.tag = in_R9;
  this_obj_00.u.float64 = in_R8.float64;
  prop.u._4_4_ = in_ECX;
  prop.u.int32 = in_stack_ffffffffffffff70;
  prop.tag = (int64_t)in_RDI;
  iVar1 = JS_DefinePropertyValueValue(local_28,this_obj_00,prop,in_stack_ffffffffffffffa0,uStack_2c)
  ;
  return iVar1;
}

Assistant:

int JS_DefinePropertyValueUint32(JSContext *ctx, JSValueConst this_obj,
                                 uint32_t idx, JSValue val, int flags)
{
    return JS_DefinePropertyValueValue(ctx, this_obj, JS_NewUint32(ctx, idx),
                                       val, flags);
}